

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O1

int __thiscall
boost::unit_test::decorator::precondition::clone
          (precondition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  vtable_base *pvVar1;
  precondition *p;
  function1<boost::test_tools::assertion_result,_unsigned_long> local_40;
  
  p = (precondition *)operator_new(0x28);
  local_40.super_function_base.vtable = (vtable_base *)0x0;
  pvVar1 = *(vtable_base **)(__fn + 8);
  if (pvVar1 != (vtable_base *)0x0) {
    local_40.super_function_base.vtable = pvVar1;
    if (((ulong)pvVar1 & 1) == 0) {
      (*pvVar1->manager)((function_buffer *)(__fn + 0x10),&local_40.super_function_base.functor,
                         clone_functor_tag);
    }
    else {
      local_40.super_function_base.functor._16_8_ = *(undefined8 *)(__fn + 0x20);
      local_40.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)(__fn + 0x10);
      local_40.super_function_base.functor._8_8_ = *(undefined8 *)(__fn + 0x18);
    }
  }
  (p->super_base)._vptr_base = (_func_int **)&PTR_apply_001ca9f0;
  (p->m_precondition).super_function1<boost::test_tools::assertion_result,_unsigned_long>.
  super_function_base.vtable = (vtable_base *)0x0;
  if (local_40.super_function_base.vtable != (vtable_base *)0x0) {
    (p->m_precondition).super_function1<boost::test_tools::assertion_result,_unsigned_long>.
    super_function_base.vtable = local_40.super_function_base.vtable;
    if (((ulong)local_40.super_function_base.vtable & 1) == 0) {
      (*(local_40.super_function_base.vtable)->manager)
                (&local_40.super_function_base.functor,
                 &(p->m_precondition).
                  super_function1<boost::test_tools::assertion_result,_unsigned_long>.
                  super_function_base.functor,clone_functor_tag);
    }
    else {
      *(undefined8 *)
       ((long)&(p->m_precondition).
               super_function1<boost::test_tools::assertion_result,_unsigned_long>.
               super_function_base.functor + 0x10) = local_40.super_function_base.functor._16_8_;
      *(obj_ptr_t *)
       &(p->m_precondition).super_function1<boost::test_tools::assertion_result,_unsigned_long>.
        super_function_base.functor = local_40.super_function_base.functor.members.obj_ptr;
      *(undefined8 *)
       ((long)&(p->m_precondition).
               super_function1<boost::test_tools::assertion_result,_unsigned_long>.
               super_function_base.functor + 8) = local_40.super_function_base.functor._8_8_;
    }
  }
  shared_ptr<boost::unit_test::decorator::base>::
  shared_ptr<boost::unit_test::decorator::precondition>
            ((shared_ptr<boost::unit_test::decorator::base> *)this,p);
  function1<boost::test_tools::assertion_result,_unsigned_long>::~function1(&local_40);
  return (int)this;
}

Assistant:

virtual base_ptr        clone() const { return base_ptr(new precondition( m_precondition )); }